

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PLYReader.cc
# Opt level: O2

void __thiscall
OpenMesh::IO::_PLYReader_::readValue(_PLYReader_ *this,ValueType _type,istream *_in,double *_value)

{
  ostream *poVar1;
  double local_20;
  float64_t tmp;
  
  if (_type - ValueTypeFLOAT64 < 2) {
    binary<double>::restore(_in,&local_20,SUB41(((this->options_).flags_ & 2U) >> 1,0));
    *_value = local_20;
    return;
  }
  *_value = 0.0;
  poVar1 = std::operator<<((ostream *)&std::cerr,"unsupported conversion type to double: ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,_type);
  std::endl<char,std::char_traits<char>>(poVar1);
  return;
}

Assistant:

void _PLYReader_::readValue(ValueType _type, std::istream& _in, double& _value) const {

    switch (_type) {

        case ValueTypeFLOAT64:

        case ValueTypeDOUBLE:

            float64_t tmp;
            restore(_in, tmp, options_.check(Options::MSB));
            _value = tmp;

            break;

    default:

        _value = 0.0;
        std::cerr << "unsupported conversion type to double: " << _type << std::endl;

        break;
    }
}